

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp.c
# Opt level: O1

c_int osqp_warm_start(OSQPWorkspace *work,c_float *x,c_float *y)

{
  c_int cVar1;
  
  if (work != (OSQPWorkspace *)0x0) {
    if (work->settings->warm_start == 0) {
      work->settings->warm_start = 1;
    }
    prea_vec_copy(x,work->x,work->data->n);
    prea_vec_copy(y,work->y,work->data->m);
    if (work->settings->scaling != 0) {
      vec_ew_prod(work->scaling->Dinv,work->x,work->x,work->data->n);
      vec_ew_prod(work->scaling->Einv,work->y,work->y,work->data->m);
      vec_mult_scalar(work->y,work->scaling->c,work->data->m);
    }
    mat_vec(work->data->A,work->x,work->z,0);
    return 0;
  }
  cVar1 = _osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR,"osqp_warm_start");
  return cVar1;
}

Assistant:

c_int osqp_warm_start(OSQPWorkspace *work, const c_float *x, const c_float *y) {

  // Check if workspace has been initialized
  if (!work) return osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR);

  // Update warm_start setting to true
  if (!work->settings->warm_start) work->settings->warm_start = 1;

  // Copy primal and dual variables into the iterates
  prea_vec_copy(x, work->x, work->data->n);
  prea_vec_copy(y, work->y, work->data->m);

  // Scale iterates
  if (work->settings->scaling) {
    vec_ew_prod(work->scaling->Dinv, work->x, work->x, work->data->n);
    vec_ew_prod(work->scaling->Einv, work->y, work->y, work->data->m);
    vec_mult_scalar(work->y, work->scaling->c, work->data->m);
  }

  // Compute Ax = z and store it in z
  mat_vec(work->data->A, work->x, work->z, 0);

  return 0;
}